

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config-c.cpp
# Opt level: O0

duckdb_state duckdb_get_config_flag(size_t index,char **out_name,char **out_description)

{
  bool bVar1;
  ConfigurationOption *pCVar2;
  idx_t iVar3;
  ExtensionEntry *pEVar4;
  undefined8 *in_RDX;
  undefined8 *in_RSI;
  long in_RDI;
  ExtensionEntry *entry;
  optional_ptr<const_duckdb::ConfigurationOption,_true> option;
  idx_t in_stack_ffffffffffffffc8;
  optional_ptr<const_duckdb::ConfigurationOption,_true> *in_stack_ffffffffffffffd0;
  ConfigurationOption *local_28;
  undefined8 *local_20;
  undefined8 *local_18;
  long local_10;
  duckdb_state local_4;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  local_28 = (ConfigurationOption *)duckdb::DBConfig::GetOptionByIndex(in_stack_ffffffffffffffc8);
  bVar1 = duckdb::optional_ptr::operator_cast_to_bool((optional_ptr *)&local_28);
  if (bVar1) {
    if (local_18 != (undefined8 *)0x0) {
      pCVar2 = duckdb::optional_ptr<const_duckdb::ConfigurationOption,_true>::operator->
                         (in_stack_ffffffffffffffd0);
      *local_18 = pCVar2->name;
    }
    if (local_20 != (undefined8 *)0x0) {
      pCVar2 = duckdb::optional_ptr<const_duckdb::ConfigurationOption,_true>::operator->
                         (in_stack_ffffffffffffffd0);
      *local_20 = pCVar2->description;
    }
    local_4 = DuckDBSuccess;
  }
  else {
    iVar3 = duckdb::DBConfig::GetOptionCount();
    pEVar4 = duckdb::ExtensionHelper::GetArrayEntry<62ul>
                       ((ExtensionEntry (*) [62])"azure_account_name",local_10 - iVar3);
    if (pEVar4 == (ExtensionEntry *)0x0) {
      local_4 = DuckDBError;
    }
    else {
      if (local_18 != (undefined8 *)0x0) {
        *local_18 = pEVar4;
      }
      if (local_20 != (undefined8 *)0x0) {
        *local_20 = pEVar4->extension;
      }
      local_4 = DuckDBSuccess;
    }
  }
  return local_4;
}

Assistant:

duckdb_state duckdb_get_config_flag(size_t index, const char **out_name, const char **out_description) {
	auto option = DBConfig::GetOptionByIndex(index);
	if (option) {
		if (out_name) {
			*out_name = option->name;
		}
		if (out_description) {
			*out_description = option->description;
		}
		return DuckDBSuccess;
	}

	// extension index?
	auto entry = duckdb::ExtensionHelper::GetArrayEntry(duckdb::EXTENSION_SETTINGS, index - DBConfig::GetOptionCount());
	if (!entry) {
		return DuckDBError;
	}
	if (out_name) {
		*out_name = entry->name;
	}
	if (out_description) {
		*out_description = entry->extension;
	}
	return DuckDBSuccess;
}